

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall MarkerIndex::insert(MarkerIndex *this,MarkerId id,Point start,Point end)

{
  int iVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_MarkerIndex::Node_*const,_Point>,_false,_false>,_bool>
  pVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false,_false>,_bool>
  pVar3;
  pair<const_unsigned_int,_MarkerIndex::Node_*> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false> local_98;
  undefined1 local_90;
  pair<const_unsigned_int,_MarkerIndex::Node_*> local_88;
  _Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false> local_78;
  undefined1 local_70;
  pair<const_MarkerIndex::Node_*const,_Point> local_68;
  _Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false> local_58;
  undefined1 local_50;
  pair<const_MarkerIndex::Node_*const,_Point> local_48;
  Node *local_38;
  Node *end_node;
  Node *start_node;
  MarkerIndex *pMStack_20;
  MarkerId id_local;
  MarkerIndex *this_local;
  Point end_local;
  Point start_local;
  
  start_node._4_4_ = id;
  pMStack_20 = this;
  this_local = (MarkerIndex *)end;
  end_local = start;
  end_node = Iterator::insert_marker_start
                       (&this->iterator,(MarkerId *)((long)&start_node + 4),&end_local,
                        (Point *)&this_local);
  local_38 = Iterator::insert_marker_end
                       (&this->iterator,(MarkerId *)((long)&start_node + 4),&end_local,
                        (Point *)&this_local);
  std::pair<const_MarkerIndex::Node_*const,_Point>::pair<MarkerIndex::Node_*&,_Point_&,_true>
            (&local_48,&end_node,&end_local);
  pVar2 = std::
          unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
          ::insert(&this->node_position_cache,&local_48);
  local_58._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>._M_cur;
  local_50 = pVar2.second;
  std::pair<const_MarkerIndex::Node_*const,_Point>::pair<MarkerIndex::Node_*&,_Point_&,_true>
            (&local_68,&local_38,(Point *)&this_local);
  pVar2 = std::
          unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
          ::insert(&this->node_position_cache,&local_68);
  local_78._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>._M_cur;
  local_70 = pVar2.second;
  flat_set<unsigned_int>::insert(&end_node->start_marker_ids,start_node._4_4_);
  flat_set<unsigned_int>::insert(&local_38->end_marker_ids,start_node._4_4_);
  if (end_node->priority == 0) {
    iVar1 = generate_random_number(this);
    end_node->priority = iVar1;
    bubble_node_up(this,end_node);
  }
  if (local_38->priority == 0) {
    iVar1 = generate_random_number(this);
    local_38->priority = iVar1;
    bubble_node_up(this,local_38);
  }
  std::pair<const_unsigned_int,_MarkerIndex::Node_*>::
  pair<unsigned_int_&,_MarkerIndex::Node_*&,_true>
            (&local_88,(uint *)((long)&start_node + 4),&end_node);
  pVar3 = std::
          unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
          ::insert(&this->start_nodes_by_id,&local_88);
  local_98._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false>._M_cur;
  local_90 = pVar3.second;
  std::pair<const_unsigned_int,_MarkerIndex::Node_*>::
  pair<unsigned_int_&,_MarkerIndex::Node_*&,_true>
            (&local_a8,(uint *)((long)&start_node + 4),&local_38);
  std::
  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
  ::insert(&this->end_nodes_by_id,&local_a8);
  return;
}

Assistant:

void MarkerIndex::insert(MarkerId id, Point start, Point end) {
  Node *start_node = iterator.insert_marker_start(id, start, end);
  Node *end_node = iterator.insert_marker_end(id, start, end);

  node_position_cache.insert({start_node, start});
  node_position_cache.insert({end_node, end});

  start_node->start_marker_ids.insert(id);
  end_node->end_marker_ids.insert(id);

  if (start_node->priority == 0) {
    start_node->priority = generate_random_number();
    bubble_node_up(start_node);
  }

  if (end_node->priority == 0) {
    end_node->priority = generate_random_number();
    bubble_node_up(end_node);
  }

  start_nodes_by_id.insert({id, start_node});
  end_nodes_by_id.insert({id, end_node});
}